

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_attribute(Context *ctx,RegisterType regtype,int regnum,MOJOSHADER_usage usage,
                        int index,int wmask,int flags)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *pcStack_a8;
  MiscTypeType mt;
  char *paramtype_str;
  char local_98 [4];
  int attr;
  char varname [64];
  char index_str [16];
  char *local_40;
  char *arrayright;
  char *arrayleft;
  char *usage_str;
  uint local_20;
  int wmask_local;
  int index_local;
  MOJOSHADER_usage usage_local;
  int regnum_local;
  RegisterType regtype_local;
  Context *ctx_local;
  
  arrayleft = (char *)0x0;
  arrayright = "";
  local_40 = "";
  memset(varname + 0x38,0,0x10);
  get_ARB1_varname_in_buf(ctx,regtype,regnum,local_98,0x40);
  if (index != 0) {
    snprintf(varname + 0x38,0x10,"%u",(ulong)(uint)index);
  }
  iVar2 = shader_is_vertex(ctx);
  if (iVar2 == 0) {
    iVar2 = shader_is_pixel(ctx);
    if (iVar2 == 0) {
      fail(ctx,"Unknown shader type");
    }
    else {
      pcStack_a8 = "ATTRIB";
      if ((flags & 4U) != 0) {
        if (ctx->profile_supports_nv4 == 0) {
          failf(ctx,"centroid unsupported in %s profile",ctx->profile->name);
          return;
        }
        pcStack_a8 = "CENTROID ATTRIB";
      }
      if (regtype == REG_TYPE_COLOROUT) {
        pcStack_a8 = "OUTPUT";
        arrayleft = "result.color";
        if (ctx->have_multi_color_outputs != 0) {
          snprintf(varname + 0x38,0x10,"%u",(ulong)(uint)regnum);
          arrayright = "[";
          local_40 = "]";
        }
      }
      else if (regtype == REG_TYPE_DEPTHOUT) {
        pcStack_a8 = "OUTPUT";
        arrayleft = "result.depth";
      }
      else if ((regtype == REG_TYPE_ADDRESS) || (regtype == REG_TYPE_INPUT)) {
        if (usage == MOJOSHADER_USAGE_TEXCOORD) {
          iVar2 = shader_version_atleast(ctx,'\x01','\x04');
          if (iVar2 != 0) {
            snprintf(varname + 0x38,0x10,"%u",(ulong)(uint)index);
            arrayleft = "fragment.texcoord";
            arrayright = "[";
            local_40 = "]";
          }
        }
        else if (usage == MOJOSHADER_USAGE_COLOR) {
          varname[0x38] = '\0';
          if (index == 0) {
            arrayleft = "fragment.color.primary";
          }
          else if (index == 1) {
            arrayleft = "fragment.color.secondary";
          }
          else {
            fail(ctx,"unsupported color index");
          }
        }
      }
      else if (regtype == REG_TYPE_MISCTYPE) {
        if (regnum == 1) {
          if (ctx->profile_supports_nv4 == 0) {
            failf(ctx,"vFace unsupported in %s profile",ctx->profile->name);
          }
          else {
            varname[0x38] = '\0';
            arrayleft = "fragment.facing";
          }
        }
        else if (regnum == 0) {
          varname[0x38] = '\0';
          arrayleft = "fragment.position";
        }
        else {
          fail(ctx,"BUG: unhandled misc register");
        }
      }
      else {
        fail(ctx,"unknown pixel shader attribute register");
      }
      if (arrayleft != (char *)0x0) {
        push_output(ctx,&ctx->globals);
        output_line(ctx,"%s %s = %s%s%s%s;",pcStack_a8,local_98,arrayleft,arrayright,varname + 0x38,
                    local_40);
        pop_output(ctx);
      }
    }
  }
  else {
    iVar2 = shader_version_atleast(ctx,'\x03','\0');
    local_20 = index;
    wmask_local = usage;
    usage_local = regtype;
    if (iVar2 == 0) {
      local_20 = regnum;
      if (regtype == REG_TYPE_RASTOUT) {
        usage_local = MOJOSHADER_USAGE_TANGENT;
        if (regnum == 0) {
          wmask_local = 0;
        }
        else if (regnum == 1) {
          wmask_local = 0xb;
        }
        else if (regnum == 2) {
          wmask_local = 4;
        }
      }
      else if (regtype == REG_TYPE_ATTROUT) {
        usage_local = MOJOSHADER_USAGE_TANGENT;
        wmask_local = 10;
      }
      else {
        local_20 = index;
        if (regtype == REG_TYPE_OUTPUT) {
          usage_local = MOJOSHADER_USAGE_TANGENT;
          wmask_local = 5;
          local_20 = regnum;
        }
      }
    }
    if (usage_local == MOJOSHADER_USAGE_BLENDWEIGHT) {
      uVar1 = ctx->assigned_vertex_attributes;
      ctx->assigned_vertex_attributes = uVar1 + 1;
      push_output(ctx,&ctx->globals);
      output_line(ctx,"ATTRIB %s = vertex.attrib[%d];",local_98,(ulong)uVar1);
      pop_output(ctx);
    }
    else if (usage_local == MOJOSHADER_USAGE_TANGENT) {
      switch(wmask_local) {
      case 0:
        ctx->arb1_wrote_position = 1;
        arrayleft = "result.position";
        break;
      default:
        break;
      case 4:
        arrayleft = "result.pointsize";
        break;
      case 5:
        snprintf(varname + 0x38,0x10,"%u",(ulong)local_20);
        arrayleft = "result.texcoord";
        arrayright = "[";
        local_40 = "]";
        break;
      case 10:
        varname[0x38] = '\0';
        if (local_20 == 0) {
          arrayleft = "result.color.primary";
        }
        else if (local_20 == 1) {
          arrayleft = "result.color.secondary";
        }
        break;
      case 0xb:
        arrayleft = "result.fogcoord";
      }
      push_output(ctx,&ctx->globals);
      if (arrayleft == (char *)0x0) {
        pcVar3 = arb1_float_temp(ctx);
        output_line(ctx,"%s %s;",pcVar3,local_98);
      }
      else {
        output_line(ctx,"OUTPUT %s = %s%s%s%s;",local_98,arrayleft,arrayright,varname + 0x38,
                    local_40);
      }
      pop_output(ctx);
    }
    else {
      fail(ctx,"unknown vertex shader attribute register");
    }
  }
  return;
}

Assistant:

static void emit_ARB1_attribute(Context *ctx, RegisterType regtype, int regnum,
                                MOJOSHADER_usage usage, int index, int wmask,
                                int flags)
{
    // !!! FIXME: this function doesn't deal with write masks at all yet!
    const char *usage_str = NULL;
    const char *arrayleft = "";
    const char *arrayright = "";
    char index_str[16] = { '\0' };

    char varname[64];
    get_ARB1_varname_in_buf(ctx, regtype, regnum, varname, sizeof (varname));

    //assert((flags & MOD_PP) == 0);  // !!! FIXME: is PP allowed?

    if (index != 0)  // !!! FIXME: a lot of these MUST be zero.
        snprintf(index_str, sizeof (index_str), "%u", (uint) index);

    if (shader_is_vertex(ctx))
    {
        // pre-vs3 output registers.
        // these don't ever happen in DCL opcodes, I think. Map to vs_3_*
        //  output registers.
        if (!shader_version_atleast(ctx, 3, 0))
        {
            if (regtype == REG_TYPE_RASTOUT)
            {
                regtype = REG_TYPE_OUTPUT;
                index = regnum;
                switch ((const RastOutType) regnum)
                {
                    case RASTOUT_TYPE_POSITION:
                        usage = MOJOSHADER_USAGE_POSITION;
                        break;
                    case RASTOUT_TYPE_FOG:
                        usage = MOJOSHADER_USAGE_FOG;
                        break;
                    case RASTOUT_TYPE_POINT_SIZE:
                        usage = MOJOSHADER_USAGE_POINTSIZE;
                        break;
                } // switch
            } // if

            else if (regtype == REG_TYPE_ATTROUT)
            {
                regtype = REG_TYPE_OUTPUT;
                usage = MOJOSHADER_USAGE_COLOR;
                index = regnum;
            } // else if

            else if (regtype == REG_TYPE_TEXCRDOUT)
            {
                regtype = REG_TYPE_OUTPUT;
                usage = MOJOSHADER_USAGE_TEXCOORD;
                index = regnum;
            } // else if
        } // if

        // to avoid limitations of various GL entry points for input
        // attributes (glSecondaryColorPointer() can only take 3 component
        // items, glVertexPointer() can't do GL_UNSIGNED_BYTE, many other
        // issues), we set up all inputs as generic vertex attributes, so we
        // can pass data in just about any form, and ignore the built-in GLSL
        // attributes like gl_SecondaryColor. Output needs to use the the
        // built-ins, though, but we don't have to worry about the GL entry
        // point limitations there.

        if (regtype == REG_TYPE_INPUT)
        {
            const int attr = ctx->assigned_vertex_attributes++;
            push_output(ctx, &ctx->globals);
            output_line(ctx, "ATTRIB %s = vertex.attrib[%d];", varname, attr);
            pop_output(ctx);
        } // if

        else if (regtype == REG_TYPE_OUTPUT)
        {
            switch (usage)
            {
                case MOJOSHADER_USAGE_POSITION:
                    ctx->arb1_wrote_position = 1;
                    usage_str = "result.position";
                    break;
                case MOJOSHADER_USAGE_POINTSIZE:
                    usage_str = "result.pointsize";
                    break;
                case MOJOSHADER_USAGE_COLOR:
                    index_str[0] = '\0';  // no explicit number.
                    if (index == 0)
                        usage_str = "result.color.primary";
                    else if (index == 1)
                        usage_str = "result.color.secondary";
                    break;
                case MOJOSHADER_USAGE_FOG:
                    usage_str = "result.fogcoord";
                    break;
                case MOJOSHADER_USAGE_TEXCOORD:
                    snprintf(index_str, sizeof (index_str), "%u", (uint) index);
                    usage_str = "result.texcoord";
                    arrayleft = "[";
                    arrayright = "]";
                    break;
                default:
                    // !!! FIXME: we need to deal with some more built-in varyings here.
                    break;
            } // switch

            // !!! FIXME: the #define is a little hacky, but it means we don't
            // !!! FIXME:  have to track these separately if this works.
            push_output(ctx, &ctx->globals);
            // no mapping to built-in var? Just make it a regular global, pray.
            if (usage_str == NULL)
                output_line(ctx, "%s %s;", arb1_float_temp(ctx), varname);
            else
            {
                output_line(ctx, "OUTPUT %s = %s%s%s%s;", varname, usage_str,
                            arrayleft, index_str, arrayright);
            } // else
            pop_output(ctx);
        } // else if

        else
        {
            fail(ctx, "unknown vertex shader attribute register");
        } // else
    } // if

    else if (shader_is_pixel(ctx))
    {
        const char *paramtype_str = "ATTRIB";

        // samplers DCLs get handled in emit_ARB1_sampler().

        if (flags & MOD_CENTROID)
        {
            if (!support_nv4(ctx))  // GL_NV_fragment_program4 adds centroid.
            {
                // !!! FIXME: should we just wing it without centroid here?
                failf(ctx, "centroid unsupported in %s profile",
                      ctx->profile->name);
                return;
            } // if

            paramtype_str = "CENTROID ATTRIB";
        } // if

        if (regtype == REG_TYPE_COLOROUT)
        {
            paramtype_str = "OUTPUT";
            usage_str = "result.color";
            if (ctx->have_multi_color_outputs)
            {
                // We have to gamble that you have GL_ARB_draw_buffers.
                // You probably do at this point if you have a sane setup.
                snprintf(index_str, sizeof (index_str), "%u", (uint) regnum);
                arrayleft = "[";
                arrayright = "]";
            } // if
        } // if

        else if (regtype == REG_TYPE_DEPTHOUT)
        {
            paramtype_str = "OUTPUT";
            usage_str = "result.depth";
        } // else if

        // !!! FIXME: can you actualy have a texture register with COLOR usage?
        else if ((regtype == REG_TYPE_TEXTURE) || (regtype == REG_TYPE_INPUT))
        {
            if (usage == MOJOSHADER_USAGE_TEXCOORD)
            {
                // ps_1_1 does a different hack for this attribute.
                //  Refer to emit_ARB1_global()'s REG_TYPE_TEXTURE code.
                if (shader_version_atleast(ctx, 1, 4))
                {
                    snprintf(index_str, sizeof (index_str), "%u", (uint) index);
                    usage_str = "fragment.texcoord";
                    arrayleft = "[";
                    arrayright = "]";
                } // if
            } // if

            else if (usage == MOJOSHADER_USAGE_COLOR)
            {
                index_str[0] = '\0';  // no explicit number.
                if (index == 0)
                    usage_str = "fragment.color.primary";
                else if (index == 1)
                    usage_str = "fragment.color.secondary";
                else
                    fail(ctx, "unsupported color index");
            } // else if
        } // else if

        else if (regtype == REG_TYPE_MISCTYPE)
        {
            const MiscTypeType mt = (MiscTypeType) regnum;
            if (mt == MISCTYPE_TYPE_FACE)
            {
                if (support_nv4(ctx))  // FINALLY, a vFace equivalent in nv4!
                {
                    index_str[0] = '\0';  // no explicit number.
                    usage_str = "fragment.facing";
                } // if
                else
                {
                    failf(ctx, "vFace unsupported in %s profile",
                          ctx->profile->name);
                } // else
            } // if
            else if (mt == MISCTYPE_TYPE_POSITION)
            {
                index_str[0] = '\0';  // no explicit number.
                usage_str = "fragment.position";  // !!! FIXME: is this the same coord space as D3D?
            } // else if
            else
            {
                fail(ctx, "BUG: unhandled misc register");
            } // else
        } // else if

        else
        {
            fail(ctx, "unknown pixel shader attribute register");
        } // else

        if (usage_str != NULL)
        {
            push_output(ctx, &ctx->globals);
            output_line(ctx, "%s %s = %s%s%s%s;", paramtype_str, varname,
                        usage_str, arrayleft, index_str, arrayright);
            pop_output(ctx);
        } // if
    } // else if

    else
    {
        fail(ctx, "Unknown shader type");  // state machine should catch this.
    } // else
}